

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_8.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_striped_profile_sse2_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  __m128i alVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  undefined1 auVar10 [16];
  char cVar11;
  parasail_result_t *ppVar12;
  __m128i *palVar13;
  __m128i *ptr;
  __m128i *ptr_00;
  int8_t *ptr_01;
  byte bVar14;
  byte bVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  ushort uVar24;
  long lVar25;
  int32_t segNum;
  int iVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  __m128i *ptr_02;
  undefined4 uVar31;
  ulong uVar33;
  undefined1 uVar42;
  undefined1 uVar44;
  byte bVar45;
  byte bVar46;
  byte bVar47;
  undefined1 auVar34 [16];
  undefined1 uVar43;
  undefined4 uVar32;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined4 uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar55;
  int iVar72;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar85;
  int iVar89;
  int iVar90;
  undefined1 auVar86 [16];
  int iVar91;
  undefined1 auVar87 [16];
  ushort uVar92;
  undefined1 auVar88 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 in_XMM8 [16];
  __m128i_8_t A;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  int iVar114;
  int iVar115;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  __m128i_8_t e;
  __m128i_8_t h;
  char local_e8;
  char cStack_e7;
  char cStack_e6;
  char cStack_e5;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  char cVar107;
  char cVar109;
  char cVar110;
  char cVar111;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_striped_profile_sse2_128_8_cold_8();
  }
  else {
    pvVar4 = (profile->profile8).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_striped_profile_sse2_128_8_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_striped_profile_sse2_128_8_cold_6();
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          parasail_sg_flags_striped_profile_sse2_128_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_striped_profile_sse2_128_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_striped_profile_sse2_128_8_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_striped_profile_sse2_128_8_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_striped_profile_sse2_128_8_cold_1();
        }
        else {
          uVar30 = uVar2 - 1;
          uVar28 = (ulong)uVar2 + 0xf >> 4;
          uVar33 = (ulong)uVar30 % uVar28;
          iVar17 = (int)(uVar30 / uVar28);
          uVar21 = -open;
          uVar3 = ppVar5->min;
          uVar29 = (uint)(byte)-(char)uVar3;
          if (uVar3 != uVar21 && SBORROW4(uVar3,uVar21) == (int)(uVar3 + open) < 0) {
            uVar29 = open;
          }
          cVar11 = '~' - (char)ppVar5->max;
          ppVar12 = parasail_result_new();
          if (ppVar12 != (parasail_result_t *)0x0) {
            iVar16 = (uint)(s1_end != 0) * 0x10;
            ppVar12->flag =
                 iVar16 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar12->flag | 0x10100802;
            palVar13 = parasail_memalign___m128i(0x10,uVar28);
            ptr = parasail_memalign___m128i(0x10,uVar28);
            ptr_00 = parasail_memalign___m128i(0x10,uVar28);
            ptr_01 = parasail_memalign_int8_t(0x10,(ulong)(s2Len + 1));
            auVar34._0_4_ = -(uint)((int)((ulong)palVar13 >> 0x20) == 0 && (int)palVar13 == 0);
            auVar34._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
            auVar34._8_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0 && (int)ptr_00 == 0);
            auVar34._12_4_ = -(uint)((int)ptr_01 == 0 && (int)((ulong)ptr_01 >> 0x20) == 0);
            iVar16 = movmskps(iVar16,auVar34);
            if (iVar16 == 0) {
              iVar16 = s2Len + -1;
              iVar19 = 0xf - iVar17;
              uVar44 = (undefined1)((uint)open >> 0x18);
              uVar43 = (undefined1)((uint)open >> 0x10);
              uVar42 = (undefined1)((uint)open >> 8);
              auVar49._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar44,uVar44),uVar43),CONCAT14(uVar43,open)) >>
                        0x20);
              auVar49[3] = uVar42;
              auVar49[2] = uVar42;
              auVar49[0] = (undefined1)open;
              auVar49[1] = auVar49[0];
              auVar49._8_8_ = 0;
              auVar34 = pshuflw(auVar49,auVar49,0);
              uVar31 = auVar34._0_4_;
              auVar54._4_4_ = uVar31;
              auVar54._0_4_ = uVar31;
              auVar54._8_4_ = uVar31;
              auVar54._12_4_ = uVar31;
              uVar42 = (undefined1)((uint)gap >> 0x10);
              uVar44 = (undefined1)((uint)gap >> 0x18);
              uVar43 = (undefined1)((uint)gap >> 8);
              auVar50._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar44,uVar44),uVar42),CONCAT14(uVar42,gap)) >>
                        0x20);
              auVar50[3] = uVar43;
              auVar50[2] = uVar43;
              auVar50[1] = (char)gap;
              auVar50[0] = (char)gap;
              auVar50._8_8_ = 0;
              auVar34 = pshuflw(auVar50,auVar50,0);
              uVar31 = auVar34._0_4_;
              bVar14 = (char)uVar29 + 0x81;
              uVar24 = (ushort)bVar14;
              auVar34 = pshuflw(ZEXT216(CONCAT11(bVar14,bVar14)),ZEXT216(CONCAT11(bVar14,bVar14)),0)
              ;
              uVar48 = auVar34._0_4_;
              auVar49 = ZEXT216(CONCAT11(cVar11,cVar11));
              auVar49 = pshuflw(auVar49,auVar49,0);
              uVar32 = auVar49._0_4_;
              auVar68._4_4_ = uVar32;
              auVar68._0_4_ = uVar32;
              auVar68._8_4_ = uVar32;
              auVar68._12_4_ = uVar32;
              uVar44 = (undefined1)((uint)iVar19 >> 0x18);
              uVar43 = (undefined1)((uint)iVar19 >> 0x10);
              uVar42 = (undefined1)((uint)iVar19 >> 8);
              auVar36._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar44,uVar44),uVar43),CONCAT14(uVar43,iVar19))
                        >> 0x20);
              auVar36[3] = uVar42;
              auVar36[2] = uVar42;
              auVar36[0] = (undefined1)iVar19;
              auVar36[1] = auVar36[0];
              auVar36._8_8_ = 0;
              auVar50 = pshuflw(auVar36,auVar36,0);
              local_e8 = auVar50[0];
              cStack_e7 = auVar50[1];
              cStack_e6 = auVar50[2];
              cStack_e5 = auVar50[3];
              lVar20 = (long)(int)uVar21;
              uVar23 = 0;
              do {
                lVar27 = 0;
                lVar25 = lVar20;
                do {
                  lVar18 = lVar25;
                  if (s1_beg != 0) {
                    lVar18 = 0;
                  }
                  uVar42 = 0x80;
                  if (-0x80 < lVar18) {
                    uVar42 = (undefined1)lVar18;
                  }
                  *(undefined1 *)((long)&local_48 + lVar27) = uVar42;
                  lVar18 = lVar18 - (ulong)(uint)open;
                  if (lVar18 < -0x7f) {
                    lVar18 = -0x80;
                  }
                  *(char *)((long)&local_58 + lVar27) = (char)lVar18;
                  lVar27 = lVar27 + 1;
                  lVar25 = lVar25 - uVar28 * (uint)gap;
                } while (lVar27 != 0x10);
                palVar13[uVar23][0] = local_48;
                palVar13[uVar23][1] = lStack_40;
                ptr_00[uVar23][0] = local_58;
                ptr_00[uVar23][1] = lStack_50;
                uVar23 = uVar23 + 1;
                lVar20 = lVar20 - (ulong)(uint)gap;
              } while (uVar23 != uVar28);
              *ptr_01 = '\0';
              auVar50 = _DAT_00903aa0;
              lVar20 = (ulong)(uint)s2Len - 1;
              auVar100._8_4_ = (int)lVar20;
              auVar100._0_8_ = lVar20;
              auVar100._12_4_ = (int)((ulong)lVar20 >> 0x20);
              iVar22 = -gap;
              auVar104._8_4_ = 0xffffffff;
              auVar104._0_8_ = 0xffffffffffffffff;
              auVar104._12_4_ = 0xffffffff;
              iVar26 = 0;
              uVar23 = 0;
              auVar36 = auVar68;
              do {
                uVar32 = (undefined4)uVar23;
                auVar105._8_4_ = uVar32;
                auVar105._0_8_ = uVar23;
                auVar105._12_4_ = (int)(uVar23 >> 0x20);
                auVar86 = auVar100 ^ auVar50;
                auVar35 = (auVar105 | _DAT_00903a90) ^ auVar50;
                iVar85 = auVar86._0_4_;
                iVar55 = -(uint)(iVar85 < auVar35._0_4_);
                iVar89 = auVar86._4_4_;
                auVar116._4_4_ = -(uint)(iVar89 < auVar35._4_4_);
                iVar90 = auVar86._8_4_;
                iVar72 = -(uint)(iVar90 < auVar35._8_4_);
                iVar91 = auVar86._12_4_;
                auVar116._12_4_ = -(uint)(iVar91 < auVar35._12_4_);
                auVar86._4_4_ = iVar55;
                auVar86._0_4_ = iVar55;
                auVar86._8_4_ = iVar72;
                auVar86._12_4_ = iVar72;
                auVar86 = pshuflw(auVar36,auVar86,0xe8);
                auVar74._0_4_ = -(uint)(auVar35._0_4_ == iVar85);
                auVar74._4_4_ = -(uint)(auVar35._4_4_ == iVar89);
                auVar74._8_4_ = -(uint)(auVar35._8_4_ == iVar90);
                auVar74._12_4_ = -(uint)(auVar35._12_4_ == iVar91);
                auVar81._4_4_ = auVar74._4_4_;
                auVar81._0_4_ = auVar74._4_4_;
                auVar81._8_4_ = auVar74._12_4_;
                auVar81._12_4_ = auVar74._12_4_;
                auVar36 = pshuflw(auVar74,auVar81,0xe8);
                auVar116._0_4_ = auVar116._4_4_;
                auVar116._8_4_ = auVar116._12_4_;
                auVar35 = pshuflw(auVar86,auVar116,0xe8);
                auVar36 = (auVar35 | auVar36 & auVar86) ^ auVar104;
                auVar36 = packssdw(auVar36,auVar36);
                iVar114 = uVar21 - (gap * 2 + iVar26);
                iVar115 = uVar21 - (gap * 3 + iVar26);
                bVar15 = -(-0x80 < (int)(uVar21 - iVar26));
                bVar45 = -(-0x80 < iVar22 - open);
                bVar46 = -(-0x80 < iVar114);
                bVar47 = -(-0x80 < iVar115);
                bVar14 = 0;
                if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  bVar15 = ~bVar15 & 0x80 | (byte)(uVar21 - iVar26) & bVar15;
                  if (s2_beg != 0) {
                    bVar15 = bVar14;
                  }
                  ptr_01[uVar23 + 1] = bVar15;
                }
                auVar35._4_4_ = iVar55;
                auVar35._0_4_ = iVar55;
                auVar35._8_4_ = iVar72;
                auVar35._12_4_ = iVar72;
                auVar116 = auVar81 & auVar35 | auVar116;
                auVar36 = packssdw(auVar116,auVar116);
                auVar36 = packssdw(auVar36 ^ auVar104,auVar36 ^ auVar104);
                auVar36 = packsswb(auVar36,auVar36);
                if ((auVar36._0_4_ >> 8 & 1) != 0) {
                  bVar15 = ~bVar45 & 0x80 | (byte)(iVar22 - open) & bVar45;
                  if (s2_beg != 0) {
                    bVar15 = bVar14;
                  }
                  ptr_01[uVar23 + 2] = bVar15;
                }
                auVar36 = (auVar105 | _DAT_00903a80) ^ auVar50;
                auVar93._0_4_ = -(uint)(iVar85 < auVar36._0_4_);
                auVar93._4_4_ = -(uint)(iVar89 < auVar36._4_4_);
                auVar93._8_4_ = -(uint)(iVar90 < auVar36._8_4_);
                auVar93._12_4_ = -(uint)(iVar91 < auVar36._12_4_);
                auVar56._4_4_ = auVar93._0_4_;
                auVar56._0_4_ = auVar93._0_4_;
                auVar56._8_4_ = auVar93._8_4_;
                auVar56._12_4_ = auVar93._8_4_;
                auVar73._4_4_ = -(uint)(auVar36._4_4_ == iVar89);
                auVar73._12_4_ = -(uint)(auVar36._12_4_ == iVar91);
                auVar73._0_4_ = auVar73._4_4_;
                auVar73._8_4_ = auVar73._12_4_;
                auVar117._4_4_ = auVar93._4_4_;
                auVar117._0_4_ = auVar93._4_4_;
                auVar117._8_4_ = auVar93._12_4_;
                auVar117._12_4_ = auVar93._12_4_;
                auVar86 = auVar73 & auVar56 | auVar117;
                auVar36 = packssdw(auVar93,auVar86);
                auVar36 = packssdw(auVar36 ^ auVar104,auVar36 ^ auVar104);
                auVar36 = packsswb(auVar36,auVar36);
                if ((auVar36._0_4_ >> 0x10 & 1) != 0) {
                  bVar15 = ~bVar46 & 0x80 | (byte)iVar114 & bVar46;
                  if (s2_beg != 0) {
                    bVar15 = bVar14;
                  }
                  ptr_01[uVar23 + 3] = bVar15;
                }
                auVar36 = pshufhw(auVar56,auVar56,0x84);
                auVar74 = pshufhw(auVar73,auVar73,0x84);
                auVar35 = pshufhw(auVar36,auVar117,0x84);
                auVar36 = (auVar35 | auVar74 & auVar36) ^ auVar104;
                auVar36 = packssdw(auVar36,auVar36);
                auVar36 = packsswb(auVar36,auVar36);
                if ((auVar36._0_4_ >> 0x18 & 1) != 0) {
                  bVar15 = ~bVar47 & 0x80 | (byte)iVar115 & bVar47;
                  if (s2_beg != 0) {
                    bVar15 = bVar14;
                  }
                  ptr_01[uVar23 + 4] = bVar15;
                }
                auVar118._4_4_ = uVar32;
                auVar118._0_4_ = uVar32;
                auVar118._8_4_ = uVar32;
                auVar118._12_4_ = uVar32;
                auVar36 = auVar118 | _DAT_00904a90;
                iVar55 = auVar36._4_4_;
                auVar75._4_4_ = iVar55;
                auVar75._0_4_ = iVar55;
                auVar75._8_4_ = auVar36._12_4_;
                auVar75._12_4_ = auVar36._12_4_;
                iVar72 = uVar21 - auVar36._0_4_ * gap;
                iVar55 = uVar21 - iVar55 * gap;
                iVar114 = uVar21 - (int)((auVar36._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                iVar115 = uVar21 - (int)((auVar75._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                bVar15 = -(-0x80 < iVar72);
                bVar45 = -(-0x80 < iVar55);
                bVar46 = -(-0x80 < iVar114);
                bVar47 = -(-0x80 < iVar115);
                auVar36 = (auVar105 | _DAT_00903ad0) ^ auVar50;
                auVar94._0_4_ = -(uint)(iVar85 < auVar36._0_4_);
                auVar94._4_4_ = -(uint)(iVar89 < auVar36._4_4_);
                auVar94._8_4_ = -(uint)(iVar90 < auVar36._8_4_);
                auVar94._12_4_ = -(uint)(iVar91 < auVar36._12_4_);
                auVar76._4_4_ = auVar94._0_4_;
                auVar76._0_4_ = auVar94._0_4_;
                auVar76._8_4_ = auVar94._8_4_;
                auVar76._12_4_ = auVar94._8_4_;
                auVar35 = pshuflw(auVar86,auVar76,0xe8);
                auVar57._4_4_ = -(uint)(auVar36._4_4_ == iVar89);
                auVar57._12_4_ = -(uint)(auVar36._12_4_ == iVar91);
                auVar57._0_4_ = auVar57._4_4_;
                auVar57._8_4_ = auVar57._12_4_;
                auVar86 = pshuflw(in_XMM8,auVar57,0xe8);
                auVar58._4_4_ = auVar94._4_4_;
                auVar58._0_4_ = auVar94._4_4_;
                auVar58._8_4_ = auVar94._12_4_;
                auVar58._12_4_ = auVar94._12_4_;
                auVar36 = pshuflw(auVar94,auVar58,0xe8);
                auVar36 = (auVar36 | auVar86 & auVar35) ^ auVar104;
                auVar36 = packssdw(auVar36,auVar36);
                auVar36 = packsswb(auVar36,auVar36);
                if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  bVar15 = ~bVar15 & 0x80 | (byte)iVar72 & bVar15;
                  if (s2_beg != 0) {
                    bVar15 = bVar14;
                  }
                  ptr_01[uVar23 + 5] = bVar15;
                }
                auVar58 = auVar57 & auVar76 | auVar58;
                auVar36 = packssdw(auVar58,auVar58);
                auVar36 = packssdw(auVar36 ^ auVar104,auVar36 ^ auVar104);
                auVar36 = packsswb(auVar36,auVar36);
                if ((auVar36._4_2_ >> 8 & 1) != 0) {
                  bVar15 = ~bVar45 & 0x80 | (byte)iVar55 & bVar45;
                  if (s2_beg != 0) {
                    bVar15 = bVar14;
                  }
                  ptr_01[uVar23 + 6] = bVar15;
                }
                auVar36 = (auVar105 | _DAT_00903ac0) ^ auVar50;
                auVar95._0_4_ = -(uint)(iVar85 < auVar36._0_4_);
                auVar95._4_4_ = -(uint)(iVar89 < auVar36._4_4_);
                auVar95._8_4_ = -(uint)(iVar90 < auVar36._8_4_);
                auVar95._12_4_ = -(uint)(iVar91 < auVar36._12_4_);
                auVar59._4_4_ = auVar95._0_4_;
                auVar59._0_4_ = auVar95._0_4_;
                auVar59._8_4_ = auVar95._8_4_;
                auVar59._12_4_ = auVar95._8_4_;
                auVar77._4_4_ = -(uint)(auVar36._4_4_ == iVar89);
                auVar77._12_4_ = -(uint)(auVar36._12_4_ == iVar91);
                auVar77._0_4_ = auVar77._4_4_;
                auVar77._8_4_ = auVar77._12_4_;
                auVar112._4_4_ = auVar95._4_4_;
                auVar112._0_4_ = auVar95._4_4_;
                auVar112._8_4_ = auVar95._12_4_;
                auVar112._12_4_ = auVar95._12_4_;
                auVar86 = auVar77 & auVar59 | auVar112;
                auVar36 = packssdw(auVar95,auVar86);
                auVar36 = packssdw(auVar36 ^ auVar104,auVar36 ^ auVar104);
                auVar36 = packsswb(auVar36,auVar36);
                if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  bVar15 = ~bVar46 & 0x80 | (byte)iVar114 & bVar46;
                  if (s2_beg != 0) {
                    bVar15 = bVar14;
                  }
                  ptr_01[uVar23 + 7] = bVar15;
                }
                auVar36 = pshufhw(auVar59,auVar59,0x84);
                auVar74 = pshufhw(auVar77,auVar77,0x84);
                auVar35 = pshufhw(auVar36,auVar112,0x84);
                auVar36 = (auVar35 | auVar74 & auVar36) ^ auVar104;
                auVar36 = packssdw(auVar36,auVar36);
                auVar36 = packsswb(auVar36,auVar36);
                if ((auVar36._6_2_ >> 8 & 1) != 0) {
                  bVar15 = ~bVar47 & 0x80 | (byte)iVar115 & bVar47;
                  if (s2_beg != 0) {
                    bVar15 = bVar14;
                  }
                  ptr_01[uVar23 + 8] = bVar15;
                }
                auVar36 = auVar118 | _DAT_00904b80;
                iVar55 = auVar36._4_4_;
                auVar78._4_4_ = iVar55;
                auVar78._0_4_ = iVar55;
                auVar78._8_4_ = auVar36._12_4_;
                auVar78._12_4_ = auVar36._12_4_;
                iVar72 = uVar21 - auVar36._0_4_ * gap;
                iVar55 = uVar21 - iVar55 * gap;
                iVar114 = uVar21 - (int)((auVar36._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                iVar115 = uVar21 - (int)((auVar78._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                bVar15 = -(-0x80 < iVar72);
                bVar45 = -(-0x80 < iVar55);
                bVar46 = -(-0x80 < iVar114);
                bVar47 = -(-0x80 < iVar115);
                auVar36 = (auVar105 | _DAT_00904b70) ^ auVar50;
                auVar96._0_4_ = -(uint)(iVar85 < auVar36._0_4_);
                auVar96._4_4_ = -(uint)(iVar89 < auVar36._4_4_);
                auVar96._8_4_ = -(uint)(iVar90 < auVar36._8_4_);
                auVar96._12_4_ = -(uint)(iVar91 < auVar36._12_4_);
                auVar79._4_4_ = auVar96._0_4_;
                auVar79._0_4_ = auVar96._0_4_;
                auVar79._8_4_ = auVar96._8_4_;
                auVar79._12_4_ = auVar96._8_4_;
                auVar86 = pshuflw(auVar86,auVar79,0xe8);
                auVar60._4_4_ = -(uint)(auVar36._4_4_ == iVar89);
                auVar60._12_4_ = -(uint)(auVar36._12_4_ == iVar91);
                auVar60._0_4_ = auVar60._4_4_;
                auVar60._8_4_ = auVar60._12_4_;
                auVar35 = pshuflw(in_XMM9,auVar60,0xe8);
                auVar61._4_4_ = auVar96._4_4_;
                auVar61._0_4_ = auVar96._4_4_;
                auVar61._8_4_ = auVar96._12_4_;
                auVar61._12_4_ = auVar96._12_4_;
                auVar36 = pshuflw(auVar96,auVar61,0xe8);
                auVar36 = (auVar36 | auVar35 & auVar86) ^ auVar104;
                auVar36 = packssdw(auVar36,auVar36);
                auVar36 = packsswb(auVar36,auVar36);
                if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  bVar15 = ~bVar15 & 0x80 | (byte)iVar72 & bVar15;
                  if (s2_beg != 0) {
                    bVar15 = bVar14;
                  }
                  ptr_01[uVar23 + 9] = bVar15;
                }
                auVar61 = auVar60 & auVar79 | auVar61;
                auVar36 = packssdw(auVar61,auVar61);
                auVar36 = packssdw(auVar36 ^ auVar104,auVar36 ^ auVar104);
                auVar36 = packsswb(auVar36,auVar36);
                if ((auVar36._8_2_ >> 8 & 1) != 0) {
                  bVar15 = ~bVar45 & 0x80 | (byte)iVar55 & bVar45;
                  if (s2_beg != 0) {
                    bVar15 = bVar14;
                  }
                  ptr_01[uVar23 + 10] = bVar15;
                }
                auVar36 = (auVar105 | _DAT_00904b60) ^ auVar50;
                auVar97._0_4_ = -(uint)(iVar85 < auVar36._0_4_);
                auVar97._4_4_ = -(uint)(iVar89 < auVar36._4_4_);
                auVar97._8_4_ = -(uint)(iVar90 < auVar36._8_4_);
                auVar97._12_4_ = -(uint)(iVar91 < auVar36._12_4_);
                auVar62._4_4_ = auVar97._0_4_;
                auVar62._0_4_ = auVar97._0_4_;
                auVar62._8_4_ = auVar97._8_4_;
                auVar62._12_4_ = auVar97._8_4_;
                auVar80._4_4_ = -(uint)(auVar36._4_4_ == iVar89);
                auVar80._12_4_ = -(uint)(auVar36._12_4_ == iVar91);
                auVar80._0_4_ = auVar80._4_4_;
                auVar80._8_4_ = auVar80._12_4_;
                auVar113._4_4_ = auVar97._4_4_;
                auVar113._0_4_ = auVar97._4_4_;
                auVar113._8_4_ = auVar97._12_4_;
                auVar113._12_4_ = auVar97._12_4_;
                auVar74 = auVar80 & auVar62 | auVar113;
                auVar36 = packssdw(auVar97,auVar74);
                auVar36 = packssdw(auVar36 ^ auVar104,auVar36 ^ auVar104);
                auVar36 = packsswb(auVar36,auVar36);
                if ((auVar36 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  bVar15 = ~bVar46 & 0x80 | (byte)iVar114 & bVar46;
                  if (s2_beg != 0) {
                    bVar15 = bVar14;
                  }
                  ptr_01[uVar23 + 0xb] = bVar15;
                }
                auVar36 = pshufhw(auVar62,auVar62,0x84);
                auVar81 = pshufhw(auVar80,auVar80,0x84);
                auVar116 = pshufhw(auVar36,auVar113,0x84);
                auVar36 = (auVar116 | auVar81 & auVar36) ^ auVar104;
                auVar36 = packssdw(auVar36,auVar36);
                auVar36 = packsswb(auVar36,auVar36);
                if ((auVar36._10_2_ >> 8 & 1) != 0) {
                  bVar15 = ~bVar47 & 0x80 | (byte)iVar115 & bVar47;
                  if (s2_beg != 0) {
                    bVar15 = bVar14;
                  }
                  ptr_01[uVar23 + 0xc] = bVar15;
                }
                auVar118 = auVar118 | _DAT_00904b90;
                iVar72 = auVar118._4_4_;
                auVar37._4_4_ = iVar72;
                auVar37._0_4_ = iVar72;
                auVar37._8_4_ = auVar118._12_4_;
                auVar37._12_4_ = auVar118._12_4_;
                iVar55 = uVar21 - auVar118._0_4_ * gap;
                iVar72 = uVar21 - iVar72 * gap;
                iVar114 = uVar21 - (int)((auVar118._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                iVar115 = uVar21 - (int)((auVar37._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                bVar15 = -(-0x80 < iVar55);
                bVar45 = -(-0x80 < iVar72);
                bVar46 = -(-0x80 < iVar114);
                bVar47 = -(-0x80 < iVar115);
                auVar36 = (auVar105 | _DAT_00904b50) ^ auVar50;
                auVar98._0_4_ = -(uint)(iVar85 < auVar36._0_4_);
                auVar98._4_4_ = -(uint)(iVar89 < auVar36._4_4_);
                auVar98._8_4_ = -(uint)(iVar90 < auVar36._8_4_);
                auVar98._12_4_ = -(uint)(iVar91 < auVar36._12_4_);
                auVar82._4_4_ = auVar98._0_4_;
                auVar82._0_4_ = auVar98._0_4_;
                auVar82._8_4_ = auVar98._8_4_;
                auVar82._12_4_ = auVar98._8_4_;
                auVar74 = pshuflw(auVar74,auVar82,0xe8);
                auVar63._4_4_ = -(uint)(auVar36._4_4_ == iVar89);
                auVar63._12_4_ = -(uint)(auVar36._12_4_ == iVar91);
                auVar63._0_4_ = auVar63._4_4_;
                auVar63._8_4_ = auVar63._12_4_;
                in_XMM9 = pshuflw(auVar35 & auVar86,auVar63,0xe8);
                in_XMM9 = in_XMM9 & auVar74;
                auVar64._4_4_ = auVar98._4_4_;
                auVar64._0_4_ = auVar98._4_4_;
                auVar64._8_4_ = auVar98._12_4_;
                auVar64._12_4_ = auVar98._12_4_;
                auVar36 = pshuflw(auVar98,auVar64,0xe8);
                auVar36 = (auVar36 | in_XMM9) ^ auVar104;
                auVar36 = packssdw(auVar36,auVar36);
                auVar36 = packsswb(auVar36,auVar36);
                if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  bVar15 = ~bVar15 & 0x80 | (byte)iVar55 & bVar15;
                  if (s2_beg != 0) {
                    bVar15 = bVar14;
                  }
                  ptr_01[uVar23 + 0xd] = bVar15;
                }
                auVar64 = auVar63 & auVar82 | auVar64;
                auVar36 = packssdw(auVar64,auVar64);
                auVar36 = packssdw(auVar36 ^ auVar104,auVar36 ^ auVar104);
                auVar36 = packsswb(auVar36,auVar36);
                if ((auVar36._12_2_ >> 8 & 1) != 0) {
                  bVar15 = ~bVar45 & 0x80 | (byte)iVar72 & bVar45;
                  if (s2_beg != 0) {
                    bVar15 = bVar14;
                  }
                  ptr_01[uVar23 + 0xe] = bVar15;
                }
                auVar36 = (auVar105 | _DAT_00904b40) ^ auVar50;
                auVar99._0_4_ = -(uint)(iVar85 < auVar36._0_4_);
                auVar99._4_4_ = -(uint)(iVar89 < auVar36._4_4_);
                auVar99._8_4_ = -(uint)(iVar90 < auVar36._8_4_);
                auVar99._12_4_ = -(uint)(iVar91 < auVar36._12_4_);
                auVar65._4_4_ = auVar99._0_4_;
                auVar65._0_4_ = auVar99._0_4_;
                auVar65._8_4_ = auVar99._8_4_;
                auVar65._12_4_ = auVar99._8_4_;
                iVar55 = -(uint)(auVar36._4_4_ == iVar89);
                iVar72 = -(uint)(auVar36._12_4_ == iVar91);
                auVar83._4_4_ = iVar55;
                auVar83._0_4_ = iVar55;
                auVar83._8_4_ = iVar72;
                auVar83._12_4_ = iVar72;
                auVar87._4_4_ = auVar99._4_4_;
                auVar87._0_4_ = auVar99._4_4_;
                auVar87._8_4_ = auVar99._12_4_;
                auVar87._12_4_ = auVar99._12_4_;
                in_XMM8 = auVar83 & auVar65 | auVar87;
                auVar36 = packssdw(auVar99,in_XMM8);
                auVar36 = packssdw(auVar36 ^ auVar104,auVar36 ^ auVar104);
                auVar36 = packsswb(auVar36,auVar36);
                if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  bVar15 = ~bVar46 & 0x80 | (byte)iVar114 & bVar46;
                  if (s2_beg != 0) {
                    bVar15 = bVar14;
                  }
                  ptr_01[uVar23 + 0xf] = bVar15;
                }
                auVar86 = pshufhw(auVar65,auVar65,0x84);
                auVar36 = pshufhw(auVar83,auVar83,0x84);
                auVar36 = auVar36 & auVar86;
                auVar86 = pshufhw(auVar86,auVar87,0x84);
                auVar86 = (auVar86 | auVar36) ^ auVar104;
                auVar86 = packssdw(auVar86,auVar86);
                auVar86 = packsswb(auVar86,auVar86);
                if ((auVar86._14_2_ >> 8 & 1) != 0) {
                  bVar15 = ~bVar47 & 0x80 | (byte)iVar115 & bVar47;
                  if (s2_beg != 0) {
                    bVar15 = bVar14;
                  }
                  ptr_01[uVar23 + 0x10] = bVar15;
                }
                auVar86 = _DAT_00904bb0;
                uVar23 = uVar23 + 0x10;
                iVar22 = iVar22 + gap * -0x10;
                iVar26 = iVar26 + gap * 0x10;
              } while ((s2Len + 0xfU & 0xfffffff0) != uVar23);
              uVar3 = (uint)uVar28;
              uVar23 = 0;
              auVar10._4_4_ = uVar48;
              auVar10._0_4_ = uVar48;
              auVar10._8_4_ = uVar48;
              auVar10._12_4_ = uVar48;
              auVar50 = auVar10;
              auVar36 = auVar10;
              iVar22 = iVar16;
              do {
                ptr_02 = ptr;
                ptr = palVar13;
                uVar9 = ptr[uVar3 - 1][0];
                auVar38._0_8_ = uVar9 << 8;
                auVar38._8_8_ = ptr[uVar3 - 1][1] << 8 | uVar9 >> 0x38;
                iVar26 = ppVar5->mapper[(byte)s2[uVar23]];
                auVar38 = ~auVar86 & ZEXT116((byte)ptr_01[uVar23]) | auVar38;
                lVar20 = 0;
                auVar100 = auVar10;
                do {
                  auVar35 = paddsb(auVar38,*(undefined1 (*) [16])
                                            ((long)pvVar4 + lVar20 + (long)iVar26 * uVar28 * 0x10));
                  auVar104 = *(undefined1 (*) [16])((long)*ptr_00 + lVar20);
                  auVar66[0] = -(auVar104[0] < auVar35[0]);
                  auVar66[1] = -(auVar104[1] < auVar35[1]);
                  auVar66[2] = -(auVar104[2] < auVar35[2]);
                  auVar66[3] = -(auVar104[3] < auVar35[3]);
                  auVar66[4] = -(auVar104[4] < auVar35[4]);
                  auVar66[5] = -(auVar104[5] < auVar35[5]);
                  auVar66[6] = -(auVar104[6] < auVar35[6]);
                  auVar66[7] = -(auVar104[7] < auVar35[7]);
                  auVar66[8] = -(auVar104[8] < auVar35[8]);
                  auVar66[9] = -(auVar104[9] < auVar35[9]);
                  auVar66[10] = -(auVar104[10] < auVar35[10]);
                  auVar66[0xb] = -(auVar104[0xb] < auVar35[0xb]);
                  auVar66[0xc] = -(auVar104[0xc] < auVar35[0xc]);
                  auVar66[0xd] = -(auVar104[0xd] < auVar35[0xd]);
                  auVar66[0xe] = -(auVar104[0xe] < auVar35[0xe]);
                  auVar66[0xf] = -(auVar104[0xf] < auVar35[0xf]);
                  auVar35 = ~auVar66 & auVar104 | auVar35 & auVar66;
                  auVar39[0] = -(auVar100[0] < auVar35[0]);
                  auVar39[1] = -(auVar100[1] < auVar35[1]);
                  auVar39[2] = -(auVar100[2] < auVar35[2]);
                  auVar39[3] = -(auVar100[3] < auVar35[3]);
                  auVar39[4] = -(auVar100[4] < auVar35[4]);
                  auVar39[5] = -(auVar100[5] < auVar35[5]);
                  auVar39[6] = -(auVar100[6] < auVar35[6]);
                  auVar39[7] = -(auVar100[7] < auVar35[7]);
                  auVar39[8] = -(auVar100[8] < auVar35[8]);
                  auVar39[9] = -(auVar100[9] < auVar35[9]);
                  auVar39[10] = -(auVar100[10] < auVar35[10]);
                  auVar39[0xb] = -(auVar100[0xb] < auVar35[0xb]);
                  auVar39[0xc] = -(auVar100[0xc] < auVar35[0xc]);
                  auVar39[0xd] = -(auVar100[0xd] < auVar35[0xd]);
                  auVar39[0xe] = -(auVar100[0xe] < auVar35[0xe]);
                  auVar39[0xf] = -(auVar100[0xf] < auVar35[0xf]);
                  auVar35 = ~auVar39 & auVar100 | auVar35 & auVar39;
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar20) = auVar35;
                  auVar51[0] = -(auVar35[0] < auVar50[0]);
                  auVar51[1] = -(auVar35[1] < auVar50[1]);
                  auVar51[2] = -(auVar35[2] < auVar50[2]);
                  auVar51[3] = -(auVar35[3] < auVar50[3]);
                  auVar51[4] = -(auVar35[4] < auVar50[4]);
                  auVar51[5] = -(auVar35[5] < auVar50[5]);
                  auVar51[6] = -(auVar35[6] < auVar50[6]);
                  auVar51[7] = -(auVar35[7] < auVar50[7]);
                  auVar51[8] = -(auVar35[8] < auVar50[8]);
                  auVar51[9] = -(auVar35[9] < auVar50[9]);
                  auVar51[10] = -(auVar35[10] < auVar50[10]);
                  auVar51[0xb] = -(auVar35[0xb] < auVar50[0xb]);
                  auVar51[0xc] = -(auVar35[0xc] < auVar50[0xc]);
                  auVar51[0xd] = -(auVar35[0xd] < auVar50[0xd]);
                  auVar51[0xe] = -(auVar35[0xe] < auVar50[0xe]);
                  auVar51[0xf] = -(auVar35[0xf] < auVar50[0xf]);
                  auVar50 = ~auVar51 & auVar35 | auVar50 & auVar51;
                  auVar67[0] = -(auVar35[0] < auVar68[0]);
                  auVar67[1] = -(auVar35[1] < auVar68[1]);
                  auVar67[2] = -(auVar35[2] < auVar68[2]);
                  auVar67[3] = -(auVar35[3] < auVar68[3]);
                  auVar67[4] = -(auVar35[4] < auVar68[4]);
                  auVar67[5] = -(auVar35[5] < auVar68[5]);
                  auVar67[6] = -(auVar35[6] < auVar68[6]);
                  auVar67[7] = -(auVar35[7] < auVar68[7]);
                  auVar67[8] = -(auVar35[8] < auVar68[8]);
                  auVar67[9] = -(auVar35[9] < auVar68[9]);
                  auVar67[10] = -(auVar35[10] < auVar68[10]);
                  auVar67[0xb] = -(auVar35[0xb] < auVar68[0xb]);
                  auVar67[0xc] = -(auVar35[0xc] < auVar68[0xc]);
                  auVar67[0xd] = -(auVar35[0xd] < auVar68[0xd]);
                  auVar67[0xe] = -(auVar35[0xe] < auVar68[0xe]);
                  auVar67[0xf] = -(auVar35[0xf] < auVar68[0xf]);
                  auVar68 = ~auVar67 & auVar68 | auVar35 & auVar67;
                  auVar106[0] = -(auVar104[0] < auVar68[0]);
                  auVar106[1] = -(auVar104[1] < auVar68[1]);
                  auVar106[2] = -(auVar104[2] < auVar68[2]);
                  auVar106[3] = -(auVar104[3] < auVar68[3]);
                  auVar106[4] = -(auVar104[4] < auVar68[4]);
                  auVar106[5] = -(auVar104[5] < auVar68[5]);
                  auVar106[6] = -(auVar104[6] < auVar68[6]);
                  auVar106[7] = -(auVar104[7] < auVar68[7]);
                  auVar106[8] = -(auVar104[8] < auVar68[8]);
                  auVar106[9] = -(auVar104[9] < auVar68[9]);
                  auVar106[10] = -(auVar104[10] < auVar68[10]);
                  auVar106[0xb] = -(auVar104[0xb] < auVar68[0xb]);
                  auVar106[0xc] = -(auVar104[0xc] < auVar68[0xc]);
                  auVar106[0xd] = -(auVar104[0xd] < auVar68[0xd]);
                  auVar106[0xe] = -(auVar104[0xe] < auVar68[0xe]);
                  auVar106[0xf] = -(auVar104[0xf] < auVar68[0xf]);
                  auVar68 = ~auVar106 & auVar68 | auVar104 & auVar106;
                  auVar84[0] = -(auVar100[0] < auVar68[0]);
                  auVar84[1] = -(auVar100[1] < auVar68[1]);
                  auVar84[2] = -(auVar100[2] < auVar68[2]);
                  auVar84[3] = -(auVar100[3] < auVar68[3]);
                  auVar84[4] = -(auVar100[4] < auVar68[4]);
                  auVar84[5] = -(auVar100[5] < auVar68[5]);
                  auVar84[6] = -(auVar100[6] < auVar68[6]);
                  auVar84[7] = -(auVar100[7] < auVar68[7]);
                  auVar84[8] = -(auVar100[8] < auVar68[8]);
                  auVar84[9] = -(auVar100[9] < auVar68[9]);
                  auVar84[10] = -(auVar100[10] < auVar68[10]);
                  auVar84[0xb] = -(auVar100[0xb] < auVar68[0xb]);
                  auVar84[0xc] = -(auVar100[0xc] < auVar68[0xc]);
                  auVar84[0xd] = -(auVar100[0xd] < auVar68[0xd]);
                  auVar84[0xe] = -(auVar100[0xe] < auVar68[0xe]);
                  auVar84[0xf] = -(auVar100[0xf] < auVar68[0xf]);
                  auVar68 = ~auVar84 & auVar68 | auVar100 & auVar84;
                  auVar35 = psubsb(auVar35,auVar54);
                  auVar6._4_4_ = uVar31;
                  auVar6._0_4_ = uVar31;
                  auVar6._8_4_ = uVar31;
                  auVar6._12_4_ = uVar31;
                  auVar104 = psubsb(auVar104,auVar6);
                  auVar69[0] = -(auVar35[0] < auVar104[0]);
                  auVar69[1] = -(auVar35[1] < auVar104[1]);
                  auVar69[2] = -(auVar35[2] < auVar104[2]);
                  auVar69[3] = -(auVar35[3] < auVar104[3]);
                  auVar69[4] = -(auVar35[4] < auVar104[4]);
                  auVar69[5] = -(auVar35[5] < auVar104[5]);
                  auVar69[6] = -(auVar35[6] < auVar104[6]);
                  auVar69[7] = -(auVar35[7] < auVar104[7]);
                  auVar69[8] = -(auVar35[8] < auVar104[8]);
                  auVar69[9] = -(auVar35[9] < auVar104[9]);
                  auVar69[10] = -(auVar35[10] < auVar104[10]);
                  auVar69[0xb] = -(auVar35[0xb] < auVar104[0xb]);
                  auVar69[0xc] = -(auVar35[0xc] < auVar104[0xc]);
                  auVar69[0xd] = -(auVar35[0xd] < auVar104[0xd]);
                  auVar69[0xe] = -(auVar35[0xe] < auVar104[0xe]);
                  auVar69[0xf] = -(auVar35[0xf] < auVar104[0xf]);
                  *(undefined1 (*) [16])((long)*ptr_00 + lVar20) =
                       ~auVar69 & auVar35 | auVar104 & auVar69;
                  auVar7._4_4_ = uVar31;
                  auVar7._0_4_ = uVar31;
                  auVar7._8_4_ = uVar31;
                  auVar7._12_4_ = uVar31;
                  auVar100 = psubsb(auVar100,auVar7);
                  auVar101[0] = -(auVar35[0] < auVar100[0]);
                  auVar101[1] = -(auVar35[1] < auVar100[1]);
                  auVar101[2] = -(auVar35[2] < auVar100[2]);
                  auVar101[3] = -(auVar35[3] < auVar100[3]);
                  auVar101[4] = -(auVar35[4] < auVar100[4]);
                  auVar101[5] = -(auVar35[5] < auVar100[5]);
                  auVar101[6] = -(auVar35[6] < auVar100[6]);
                  auVar101[7] = -(auVar35[7] < auVar100[7]);
                  auVar101[8] = -(auVar35[8] < auVar100[8]);
                  auVar101[9] = -(auVar35[9] < auVar100[9]);
                  auVar101[10] = -(auVar35[10] < auVar100[10]);
                  auVar101[0xb] = -(auVar35[0xb] < auVar100[0xb]);
                  auVar101[0xc] = -(auVar35[0xc] < auVar100[0xc]);
                  auVar101[0xd] = -(auVar35[0xd] < auVar100[0xd]);
                  auVar101[0xe] = -(auVar35[0xe] < auVar100[0xe]);
                  auVar101[0xf] = -(auVar35[0xf] < auVar100[0xf]);
                  auVar100 = ~auVar101 & auVar35 | auVar100 & auVar101;
                  auVar38 = *(undefined1 (*) [16])((long)*ptr + lVar20);
                  lVar20 = lVar20 + 0x10;
                } while (uVar28 << 4 != lVar20);
                iVar26 = 0;
                do {
                  uVar29 = uVar21;
                  if (s2_beg == 0) {
                    uVar29 = ptr_01[uVar23 + 1] - open;
                  }
                  if ((int)uVar29 < -0x7f) {
                    uVar29 = 0xffffff80;
                  }
                  auVar102._0_8_ = auVar100._0_8_ << 8;
                  auVar102._8_8_ = auVar100._8_8_ << 8 | auVar100._0_8_ >> 0x38;
                  auVar100 = auVar102 | ~auVar86 & ZEXT416(uVar29);
                  lVar20 = 0;
                  do {
                    auVar104 = *(undefined1 (*) [16])((long)*ptr_02 + lVar20);
                    auVar70[0] = -(auVar100[0] < auVar104[0]);
                    auVar70[1] = -(auVar100[1] < auVar104[1]);
                    auVar70[2] = -(auVar100[2] < auVar104[2]);
                    auVar70[3] = -(auVar100[3] < auVar104[3]);
                    auVar70[4] = -(auVar100[4] < auVar104[4]);
                    auVar70[5] = -(auVar100[5] < auVar104[5]);
                    auVar70[6] = -(auVar100[6] < auVar104[6]);
                    auVar70[7] = -(auVar100[7] < auVar104[7]);
                    auVar70[8] = -(auVar100[8] < auVar104[8]);
                    auVar70[9] = -(auVar100[9] < auVar104[9]);
                    auVar70[10] = -(auVar100[10] < auVar104[10]);
                    auVar70[0xb] = -(auVar100[0xb] < auVar104[0xb]);
                    auVar70[0xc] = -(auVar100[0xc] < auVar104[0xc]);
                    auVar70[0xd] = -(auVar100[0xd] < auVar104[0xd]);
                    auVar70[0xe] = -(auVar100[0xe] < auVar104[0xe]);
                    auVar70[0xf] = -(auVar100[0xf] < auVar104[0xf]);
                    auVar104 = ~auVar70 & auVar100 | auVar104 & auVar70;
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar20) = auVar104;
                    auVar40[0] = -(auVar104[0] < auVar68[0]);
                    auVar40[1] = -(auVar104[1] < auVar68[1]);
                    auVar40[2] = -(auVar104[2] < auVar68[2]);
                    auVar40[3] = -(auVar104[3] < auVar68[3]);
                    auVar40[4] = -(auVar104[4] < auVar68[4]);
                    auVar40[5] = -(auVar104[5] < auVar68[5]);
                    auVar40[6] = -(auVar104[6] < auVar68[6]);
                    auVar40[7] = -(auVar104[7] < auVar68[7]);
                    auVar40[8] = -(auVar104[8] < auVar68[8]);
                    auVar40[9] = -(auVar104[9] < auVar68[9]);
                    auVar40[10] = -(auVar104[10] < auVar68[10]);
                    auVar40[0xb] = -(auVar104[0xb] < auVar68[0xb]);
                    auVar40[0xc] = -(auVar104[0xc] < auVar68[0xc]);
                    auVar40[0xd] = -(auVar104[0xd] < auVar68[0xd]);
                    auVar40[0xe] = -(auVar104[0xe] < auVar68[0xe]);
                    auVar40[0xf] = -(auVar104[0xf] < auVar68[0xf]);
                    auVar68 = ~auVar40 & auVar68 | auVar104 & auVar40;
                    auVar52[0] = -(auVar104[0] < auVar50[0]);
                    auVar52[1] = -(auVar104[1] < auVar50[1]);
                    auVar52[2] = -(auVar104[2] < auVar50[2]);
                    auVar52[3] = -(auVar104[3] < auVar50[3]);
                    auVar52[4] = -(auVar104[4] < auVar50[4]);
                    auVar52[5] = -(auVar104[5] < auVar50[5]);
                    auVar52[6] = -(auVar104[6] < auVar50[6]);
                    auVar52[7] = -(auVar104[7] < auVar50[7]);
                    auVar52[8] = -(auVar104[8] < auVar50[8]);
                    auVar52[9] = -(auVar104[9] < auVar50[9]);
                    auVar52[10] = -(auVar104[10] < auVar50[10]);
                    auVar52[0xb] = -(auVar104[0xb] < auVar50[0xb]);
                    auVar52[0xc] = -(auVar104[0xc] < auVar50[0xc]);
                    auVar52[0xd] = -(auVar104[0xd] < auVar50[0xd]);
                    auVar52[0xe] = -(auVar104[0xe] < auVar50[0xe]);
                    auVar52[0xf] = -(auVar104[0xf] < auVar50[0xf]);
                    auVar50 = ~auVar52 & auVar104 | auVar50 & auVar52;
                    auVar104 = psubsb(auVar104,auVar54);
                    auVar8._4_4_ = uVar31;
                    auVar8._0_4_ = uVar31;
                    auVar8._8_4_ = uVar31;
                    auVar8._12_4_ = uVar31;
                    auVar100 = psubsb(auVar100,auVar8);
                    auVar41[0] = -(auVar104[0] < auVar100[0]);
                    auVar41[1] = -(auVar104[1] < auVar100[1]);
                    auVar41[2] = -(auVar104[2] < auVar100[2]);
                    auVar41[3] = -(auVar104[3] < auVar100[3]);
                    auVar41[4] = -(auVar104[4] < auVar100[4]);
                    auVar41[5] = -(auVar104[5] < auVar100[5]);
                    auVar41[6] = -(auVar104[6] < auVar100[6]);
                    auVar41[7] = -(auVar104[7] < auVar100[7]);
                    auVar41[8] = -(auVar104[8] < auVar100[8]);
                    auVar41[9] = -(auVar104[9] < auVar100[9]);
                    auVar41[10] = -(auVar104[10] < auVar100[10]);
                    auVar41[0xb] = -(auVar104[0xb] < auVar100[0xb]);
                    auVar41[0xc] = -(auVar104[0xc] < auVar100[0xc]);
                    auVar41[0xd] = -(auVar104[0xd] < auVar100[0xd]);
                    auVar41[0xe] = -(auVar104[0xe] < auVar100[0xe]);
                    auVar41[0xf] = -(auVar104[0xf] < auVar100[0xf]);
                    if ((((((((((((((((auVar41 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar41 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar41 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar41 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar41 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar41 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar41 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar41 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar41 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar41 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar41 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar41 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar41 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar41[0xf]) goto LAB_0057a754;
                    lVar20 = lVar20 + 0x10;
                  } while (uVar28 << 4 != lVar20);
                  iVar26 = iVar26 + 1;
                } while (iVar26 != 0x10);
LAB_0057a754:
                alVar1 = ptr_02[uVar33];
                auVar71[0] = -(auVar36[0] < (char)alVar1[0]);
                auVar71[1] = -(auVar36[1] < alVar1[0]._1_1_);
                auVar71[2] = -(auVar36[2] < alVar1[0]._2_1_);
                auVar71[3] = -(auVar36[3] < alVar1[0]._3_1_);
                auVar71[4] = -(auVar36[4] < alVar1[0]._4_1_);
                auVar71[5] = -(auVar36[5] < alVar1[0]._5_1_);
                auVar71[6] = -(auVar36[6] < alVar1[0]._6_1_);
                auVar71[7] = -(auVar36[7] < alVar1[0]._7_1_);
                auVar71[8] = -(auVar36[8] < (char)alVar1[1]);
                auVar71[9] = -(auVar36[9] < alVar1[1]._1_1_);
                auVar71[10] = -(auVar36[10] < alVar1[1]._2_1_);
                auVar71[0xb] = -(auVar36[0xb] < alVar1[1]._3_1_);
                auVar71[0xc] = -(auVar36[0xc] < alVar1[1]._4_1_);
                auVar71[0xd] = -(auVar36[0xd] < alVar1[1]._5_1_);
                auVar71[0xe] = -(auVar36[0xe] < alVar1[1]._6_1_);
                auVar71[0xf] = -(auVar36[0xf] < alVar1[1]._7_1_);
                auVar103[1] = -(cStack_e7 == '\x0e');
                auVar103[0] = -(local_e8 == '\x0f');
                auVar103[2] = -(cStack_e6 == '\r');
                auVar103[3] = -(cStack_e5 == '\f');
                auVar103[4] = -(local_e8 == '\v');
                auVar103[5] = -(cStack_e7 == '\n');
                auVar103[6] = -(cStack_e6 == '\t');
                auVar103[7] = -(cStack_e5 == '\b');
                auVar103[8] = -(local_e8 == '\a');
                auVar103[9] = -(cStack_e7 == '\x06');
                auVar103[10] = -(cStack_e6 == '\x05');
                auVar103[0xb] = -(cStack_e5 == '\x04');
                auVar103[0xc] = -(local_e8 == '\x03');
                auVar103[0xd] = -(cStack_e7 == '\x02');
                auVar103[0xe] = -(cStack_e6 == '\x01');
                auVar103[0xf] = -(cStack_e5 == '\0');
                auVar103 = auVar71 & auVar103;
                if ((((((((((((((((auVar103 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 || (auVar103 >> 0xf & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                (auVar103 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar103 >> 0x1f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar103 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar103 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar103 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar103 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                          || (auVar103 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar103 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar103 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar103 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar103 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar103 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar103 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar103[0xf] < '\0') {
                  iVar22 = (int)uVar23;
                }
                auVar36 = ~auVar71 & auVar36 | (undefined1  [16])alVar1 & auVar71;
                uVar92 = auVar36._14_2_;
                uVar23 = uVar23 + 1;
                palVar13 = ptr_02;
                if (uVar23 == (uint)s2Len) {
                  if (s2_end != 0) {
                    if (iVar17 < 0xf) {
                      iVar26 = 0;
                      do {
                        auVar88._0_8_ = auVar36._0_8_ << 8;
                        auVar88._8_8_ = auVar36._8_8_ << 8 | auVar36._0_8_ >> 0x38;
                        uVar92 = auVar36._13_2_;
                        iVar26 = iVar26 + 1;
                        auVar36 = auVar88;
                      } while (iVar26 < iVar19);
                    }
                    uVar24 = uVar92 >> 8;
                  }
                  cVar11 = (char)uVar24;
                  uVar29 = uVar30;
                  if ((s1_end != 0) && (((ulong)uVar2 + 0xf & 0x7ffffff0) != 0)) {
                    uVar28 = 0;
                    do {
                      uVar21 = ((uint)uVar28 & 0xf) * uVar3 + ((uint)(uVar28 >> 4) & 0xfffffff);
                      if ((int)uVar21 < (int)uVar2) {
                        bVar14 = *(byte *)((long)*ptr_02 + uVar28);
                        if ((char)(byte)uVar24 < (char)bVar14) {
                          uVar24 = (ushort)bVar14;
                          iVar22 = iVar16;
                          uVar29 = uVar21;
                        }
                        else {
                          if ((int)uVar29 <= (int)uVar21) {
                            uVar21 = uVar29;
                          }
                          if (iVar22 != iVar16) {
                            uVar21 = uVar29;
                          }
                          if (bVar14 == (byte)uVar24) {
                            uVar29 = uVar21;
                          }
                        }
                      }
                      cVar11 = (char)uVar24;
                      uVar28 = uVar28 + 1;
                    } while ((uVar3 & 0x7ffffff) << 4 != (int)uVar28);
                  }
                  if (s2_end == 0 && s1_end == 0) {
                    uVar28 = ptr_02[uVar33][1];
                    if (iVar17 < 0xf) {
                      iVar17 = 0;
                      uVar33 = ptr_02[uVar33][0];
                      do {
                        uVar28 = uVar28 << 8 | uVar33 >> 0x38;
                        iVar17 = iVar17 + 1;
                        uVar33 = uVar33 << 8;
                      } while (iVar17 < iVar19);
                    }
                    cVar11 = (char)(uVar28 >> 0x38);
                    iVar22 = iVar16;
                    uVar29 = uVar30;
                  }
                  cVar107 = auVar34[0];
                  auVar108[0] = -(auVar68[0] < cVar107);
                  cVar109 = auVar34[1];
                  auVar108[1] = -(auVar68[1] < cVar109);
                  cVar110 = auVar34[2];
                  auVar108[2] = -(auVar68[2] < cVar110);
                  cVar111 = auVar34[3];
                  auVar108[3] = -(auVar68[3] < cVar111);
                  auVar108[4] = -(auVar68[4] < cVar107);
                  auVar108[5] = -(auVar68[5] < cVar109);
                  auVar108[6] = -(auVar68[6] < cVar110);
                  auVar108[7] = -(auVar68[7] < cVar111);
                  auVar108[8] = -(auVar68[8] < cVar107);
                  auVar108[9] = -(auVar68[9] < cVar109);
                  auVar108[10] = -(auVar68[10] < cVar110);
                  auVar108[0xb] = -(auVar68[0xb] < cVar111);
                  auVar108[0xc] = -(auVar68[0xc] < cVar107);
                  auVar108[0xd] = -(auVar68[0xd] < cVar109);
                  auVar108[0xe] = -(auVar68[0xe] < cVar110);
                  auVar108[0xf] = -(auVar68[0xf] < cVar111);
                  cVar107 = auVar49[0];
                  auVar53[0] = -(cVar107 < auVar50[0]);
                  cVar109 = auVar49[1];
                  auVar53[1] = -(cVar109 < auVar50[1]);
                  cVar110 = auVar49[2];
                  auVar53[2] = -(cVar110 < auVar50[2]);
                  cVar111 = auVar49[3];
                  auVar53[3] = -(cVar111 < auVar50[3]);
                  auVar53[4] = -(cVar107 < auVar50[4]);
                  auVar53[5] = -(cVar109 < auVar50[5]);
                  auVar53[6] = -(cVar110 < auVar50[6]);
                  auVar53[7] = -(cVar111 < auVar50[7]);
                  auVar53[8] = -(cVar107 < auVar50[8]);
                  auVar53[9] = -(cVar109 < auVar50[9]);
                  auVar53[10] = -(cVar110 < auVar50[10]);
                  auVar53[0xb] = -(cVar111 < auVar50[0xb]);
                  auVar53[0xc] = -(cVar107 < auVar50[0xc]);
                  auVar53[0xd] = -(cVar109 < auVar50[0xd]);
                  auVar53[0xe] = -(cVar110 < auVar50[0xe]);
                  auVar53[0xf] = -(cVar111 < auVar50[0xf]);
                  auVar53 = auVar53 | auVar108;
                  if ((((((((((((((((auVar53 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar53 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar53 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar53 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar53 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar53 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar53 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar53 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar53 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar53 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar53 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar53 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar53 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar53[0xf] < '\0') {
                    *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
                    cVar11 = '\0';
                    iVar22 = 0;
                    uVar29 = 0;
                  }
                  ppVar12->score = (int)cVar11;
                  ppVar12->end_query = uVar29;
                  ppVar12->end_ref = iVar22;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  parasail_free(ptr_02);
                  return ppVar12;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi8(_mm_set1_epi8(position),
            _mm_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi8_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi8(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi8_rpl(vH, vE);
            vH = _mm_max_epi8_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi8(vH, vGapO);
            vE = _mm_subs_epi8(vE, vGapE);
            vE = _mm_max_epi8_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm_slli_si128(vF, 1);
            vF = _mm_insert_epi8_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi8_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi8(vH, vGapO);
                vF = _mm_subs_epi8(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm_max_epi8_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi8(vH, vMaxH));
            vMaxH = _mm_max_epi8_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8_rpl (vH, 15);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 1);
        }
        score = (int8_t) _mm_extract_epi8_rpl(vMaxH, 15);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            score = (int8_t) _mm_extract_epi8_rpl (vH, 15);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}